

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LogToTTY(int max_depth)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow *window;
  ImGuiContext *g;
  int max_depth_local;
  
  pIVar1 = GImGui;
  if ((GImGui->LogEnabled & 1U) == 0) {
    pIVar2 = GetCurrentWindowRead();
    pIVar1->LogEnabled = true;
    pIVar1->LogFile = _stdout;
    pIVar1->LogStartDepth = (pIVar2->DC).TreeDepth;
    if (-1 < max_depth) {
      pIVar1->LogAutoExpandMaxDepth = max_depth;
    }
  }
  return;
}

Assistant:

void ImGui::LogToTTY(int max_depth)
{
    ImGuiContext& g = *GImGui;
    if (g.LogEnabled)
        return;
    ImGuiWindow* window = GetCurrentWindowRead();

    g.LogEnabled = true;
    g.LogFile = stdout;
    g.LogStartDepth = window->DC.TreeDepth;
    if (max_depth >= 0)
        g.LogAutoExpandMaxDepth = max_depth;
}